

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(SessionHandle *data,connectdata **in_connect,_Bool *asyncp,
                     _Bool *protocol_done)

{
  curl_proxytype cVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  _Bool _Var5;
  int iVar6;
  CURLcode CVar7;
  SessionHandle *pSVar8;
  size_t sVar9;
  connectdata *pcVar10;
  char *pcVar11;
  curl_llist *pcVar12;
  size_t sVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  size_t sVar17;
  ulong uVar18;
  connectdata *pcVar19;
  long lVar20;
  hostname *host;
  Curl_handler **ppCVar21;
  Curl_handler *pCVar22;
  bool bVar23;
  _Bool _Var24;
  timeval tVar25;
  _Bool waitpipe;
  _Bool force_reuse;
  char *passwd;
  char *user;
  char *options;
  char *userp;
  connectdata *conn_temp;
  char *passwdp;
  char protobuf [16];
  _Bool local_c2;
  _Bool local_c1;
  char *local_c0;
  char *local_b8;
  connectdata **local_b0;
  _Bool *local_a8;
  char *local_a0;
  char *local_98;
  size_t local_90;
  char *local_88;
  SessionHandle *local_80;
  char *local_78;
  size_t local_70;
  connectdata *local_68;
  char *local_60;
  char *local_58;
  _Bool *local_50;
  undefined1 local_48 [16];
  
  *asyncp = false;
  local_68 = (connectdata *)0x0;
  local_98 = (char *)0x0;
  local_a0 = (char *)0x0;
  local_88 = (char *)0x0;
  local_c1 = false;
  local_c2 = false;
  local_50 = protocol_done;
  pSVar8 = (SessionHandle *)Curl_multi_max_host_connections(data->multi);
  sVar9 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  if ((data->change).url == (char *)0x0) {
    CVar7 = CURLE_URL_MALFORMAT;
    in_connect = in_connect;
    asyncp = asyncp;
    goto LAB_00577e54;
  }
  local_80 = pSVar8;
  pcVar10 = (connectdata *)(*Curl_ccalloc)(1,0x5a0);
  if (pcVar10 == (connectdata *)0x0) {
LAB_00577484:
    pcVar10 = (connectdata *)0x0;
  }
  else {
    pcVar10->handler = &Curl_handler_dummy;
    pcVar10->connection_id = -1;
    pcVar10->port = -1;
    pcVar10->remote_port = -1;
    pcVar10->sock[0] = -1;
    pcVar10->sock[1] = -1;
    pcVar10->tempsock[0] = -1;
    pcVar10->tempsock[1] = -1;
    (pcVar10->bits).close = true;
    tVar25 = curlx_tvnow();
    pcVar10->created = tVar25;
    pcVar10->data = data;
    cVar1 = (data->set).proxytype;
    pcVar10->proxytype = cVar1;
    pcVar11 = (data->set).str[0xf];
    if (pcVar11 == (char *)0x0) {
      (pcVar10->bits).proxy = false;
LAB_00577345:
      _Var24 = false;
    }
    else {
      bVar23 = *pcVar11 == '\0';
      (pcVar10->bits).proxy = !bVar23;
      if (bVar23) goto LAB_00577345;
      if (cVar1 == CURLPROXY_HTTP) {
        _Var24 = true;
      }
      else {
        _Var24 = cVar1 == CURLPROXY_HTTP_1_0;
      }
    }
    (pcVar10->bits).httpproxy = _Var24;
    (pcVar10->bits).proxy_user_passwd = (data->set).str[0x1f] != (char *)0x0;
    (pcVar10->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
    (pcVar10->bits).user_passwd = (data->set).str[0x1c] != (char *)0x0;
    (pcVar10->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
    (pcVar10->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
    pcVar10->verifypeer = (data->set).ssl.verifypeer;
    pcVar10->verifyhost = (data->set).ssl.verifyhost;
    pcVar10->ip_version = (data->set).ipver;
    _Var24 = Curl_pipeline_wanted(data->multi,1);
    if ((_Var24) && (pcVar10->master_buffer == (char *)0x0)) {
      pcVar11 = (char *)(*Curl_ccalloc)(0x4000,1);
      pcVar10->master_buffer = pcVar11;
      if (pcVar11 != (char *)0x0) goto LAB_00577400;
LAB_0057743a:
      Curl_llist_destroy(pcVar10->send_pipe,(void *)0x0);
      Curl_llist_destroy(pcVar10->recv_pipe,(void *)0x0);
      pcVar10->send_pipe = (curl_llist *)0x0;
      pcVar10->recv_pipe = (curl_llist *)0x0;
      (*Curl_cfree)(pcVar10->master_buffer);
      (*Curl_cfree)(pcVar10->localdev);
      (*Curl_cfree)(pcVar10);
      goto LAB_00577484;
    }
LAB_00577400:
    pcVar12 = Curl_llist_alloc(llist_dtor);
    pcVar10->send_pipe = pcVar12;
    pcVar12 = Curl_llist_alloc(llist_dtor);
    pcVar10->recv_pipe = pcVar12;
    if (pcVar12 == (curl_llist *)0x0 || pcVar10->send_pipe == (curl_llist *)0x0) goto LAB_0057743a;
    pcVar11 = (data->set).str[5];
    if (pcVar11 != (char *)0x0) {
      pcVar11 = (*Curl_cstrdup)(pcVar11);
      pcVar10->localdev = pcVar11;
      if (pcVar11 == (char *)0x0) goto LAB_0057743a;
    }
    pcVar10->localportrange = (data->set).localportrange;
    pcVar10->localport = (data->set).localport;
    pcVar10->fclosesocket = (data->set).fclosesocket;
    pcVar10->closesocket_client = (data->set).closesocket_client;
  }
  if (pcVar10 == (connectdata *)0x0) {
LAB_00577e4f:
    CVar7 = CURLE_OUT_OF_MEMORY;
    goto LAB_00577e54;
  }
  *in_connect = pcVar10;
  local_a8 = asyncp;
  sVar13 = strlen((data->change).url);
  sVar15 = 0x100;
  if (0x100 < sVar13) {
    sVar15 = sVar13;
  }
  (*Curl_cfree)((data->state).pathbuffer);
  (data->state).pathbuffer = (char *)0x0;
  (data->state).path = (char *)0x0;
  pcVar11 = (char *)(*Curl_cmalloc)(sVar15 + 2);
  (data->state).pathbuffer = pcVar11;
  if (pcVar11 != (char *)0x0) {
    (data->state).path = pcVar11;
    pcVar11 = (char *)(*Curl_cmalloc)(sVar15 + 2);
    (pcVar10->host).rawalloc = pcVar11;
    if (pcVar11 != (char *)0x0) {
      (pcVar10->host).name = pcVar11;
      *pcVar11 = '\0';
      local_b0 = in_connect;
      local_98 = (*Curl_cstrdup)("");
      local_a0 = (*Curl_cstrdup)("");
      local_88 = (*Curl_cstrdup)("");
      asyncp = local_a8;
      if (local_88 == (char *)0x0 || (local_a0 == (char *)0x0 || local_98 == (char *)0x0)) {
        CVar7 = CURLE_OUT_OF_MEMORY;
        in_connect = local_b0;
        goto LAB_00577e54;
      }
      pcVar11 = (data->state).path;
      local_48 = (undefined1  [16])0x0;
      pcVar16 = (data->change).url;
      pcVar14 = strpbrk(pcVar16,"\r\n");
      local_70 = sVar9;
      if (pcVar14 == (char *)0x0) {
        local_c0 = local_48;
        local_b8 = pcVar11;
        iVar6 = __isoc99_sscanf(pcVar16,"%15[^:]:%[^\n]",local_c0,pcVar11);
        in_connect = local_b0;
        if ((iVar6 == 2) &&
           (iVar6 = Curl_raw_equal(local_48,"file"), pcVar11 = local_b8, iVar6 != 0)) {
          if ((*local_b8 == '/') && (local_b8[1] == '/')) {
            pcVar16 = local_b8 + 2;
            sVar15 = strlen(pcVar16);
            memmove(pcVar11,pcVar16,sVar15 + 1);
          }
          if ((*pcVar11 != '/') && (pcVar16 = strchr(pcVar11,0x2f), pcVar16 != (char *)0x0)) {
            pcVar14 = pcVar16 + 1;
            if (pcVar16[1] != '/') {
              pcVar14 = pcVar16;
            }
            sVar15 = strlen(pcVar14);
            memmove(pcVar11,pcVar14,sVar15 + 1);
          }
          bVar23 = false;
          local_c0 = "file";
        }
        else {
          *local_b8 = '\0';
          bVar23 = false;
          iVar6 = __isoc99_sscanf((data->change).url,"%15[^\n:]://%[^\n/?]%[^\n]",local_48,
                                  (pcVar10->host).name);
          if (iVar6 < 2) {
            iVar6 = __isoc99_sscanf((data->change).url,"%[^\n/?]%[^\n]",(pcVar10->host).name,
                                    local_b8);
            if (iVar6 < 1) {
              bVar23 = false;
              Curl_failf(data,"<url> malformed");
              CVar7 = CURLE_URL_MALFORMAT;
              goto LAB_00577d1f;
            }
            iVar6 = Curl_raw_nequal("FTP.",(pcVar10->host).name,4);
            if (iVar6 == 0) {
              bVar23 = true;
              iVar6 = Curl_raw_nequal("DICT.",(pcVar10->host).name,5);
              if (iVar6 == 0) {
                iVar6 = Curl_raw_nequal("LDAP.",(pcVar10->host).name,5);
                if (iVar6 == 0) {
                  iVar6 = Curl_raw_nequal("IMAP.",(pcVar10->host).name,5);
                  if (iVar6 == 0) {
                    iVar6 = Curl_raw_nequal("SMTP.",(pcVar10->host).name,5);
                    if (iVar6 == 0) {
                      iVar6 = Curl_raw_nequal("POP3.",(pcVar10->host).name,5);
                      local_c0 = "pop3";
                      if (iVar6 == 0) {
                        local_c0 = "http";
                      }
                    }
                    else {
                      local_c0 = "smtp";
                    }
                  }
                  else {
                    local_c0 = "IMAP";
                  }
                }
                else {
                  local_c0 = "LDAP";
                }
              }
              else {
                local_c0 = "DICT";
              }
            }
            else {
              bVar23 = true;
              local_c0 = "ftp";
            }
          }
        }
        pcVar11 = (pcVar10->host).name;
        pcVar14 = strchr(pcVar11,0x40);
        pcVar16 = pcVar14 + 1;
        if (pcVar14 == (char *)0x0) {
          pcVar16 = pcVar11;
        }
        pcVar11 = strchr(pcVar16,0x3f);
        if (pcVar11 == (char *)0x0) {
          pcVar16 = local_b8;
          if (*local_b8 == '\0') {
            local_b8[0] = '/';
            local_b8[1] = '\0';
            goto LAB_00577906;
          }
          bVar3 = false;
        }
        else {
          local_90 = strlen(pcVar11);
          pcVar16 = local_b8;
          sVar15 = strlen(local_b8);
          memmove(pcVar16 + local_90 + 1,pcVar16,sVar15 + 1);
          memcpy(pcVar16 + 1,pcVar11,local_90);
          *pcVar16 = '/';
          *pcVar11 = '\0';
LAB_00577906:
          bVar3 = true;
        }
        if (*pcVar16 == '?') {
          sVar15 = strlen(pcVar16);
          memmove(pcVar16 + 1,pcVar16,sVar15 + 1);
          *pcVar16 = '/';
          bVar3 = true;
LAB_005779bc:
          if (bVar3) {
            local_90 = strlen(local_b8);
            sVar15 = strlen((data->change).url);
            sVar13 = strlen((pcVar10->host).name);
            if (!bVar23) {
              sVar17 = strlen(local_c0);
              sVar13 = sVar13 + sVar17 + 3;
            }
            pcVar11 = (char *)(*Curl_cmalloc)(sVar15 + 2);
            if (pcVar11 == (char *)0x0) goto LAB_00577bed;
            memcpy(pcVar11,(data->change).url,sVar13);
            memcpy(pcVar11 + sVar13,local_b8,local_90 + 1);
            if ((data->change).url_alloc == true) {
              (*Curl_cfree)((data->change).url);
              (data->change).url = (char *)0x0;
              (data->change).url_alloc = false;
            }
            Curl_infof(data,"Rebuilt URL to: %s\n",pcVar11);
            (data->change).url = pcVar11;
            (data->change).url_alloc = true;
          }
          CVar7 = CURLE_OK;
          local_78 = (char *)0x0;
          local_58 = (char *)0x0;
          local_60 = (char *)0x0;
          pcVar11 = (pcVar10->host).name;
          pcVar16 = strchr(pcVar11,0x40);
          if (pcVar16 != (char *)0x0) {
            (pcVar10->host).name = pcVar16 + 1;
            if (((data->set).use_netrc != CURL_NETRC_REQUIRED) &&
               (CVar7 = parse_login_details(pcVar11,(size_t)(pcVar16 + 1 + ~(ulong)pcVar11),
                                            &local_78,&local_58,&local_60), CVar7 == CURLE_OK)) {
              if (local_78 != (char *)0x0) {
                (pcVar10->bits).userpwd_in_url = true;
                (pcVar10->bits).user_passwd = true;
                pcVar11 = curl_easy_unescape(data,local_78,0,(int *)0x0);
                if (pcVar11 == (char *)0x0) {
                  CVar7 = CURLE_OUT_OF_MEMORY;
                  goto LAB_00577b1a;
                }
                (*Curl_cfree)(local_98);
                local_98 = pcVar11;
              }
              CVar7 = CURLE_OK;
              if (local_58 != (char *)0x0) {
                pcVar11 = curl_easy_unescape(data,local_58,0,(int *)0x0);
                if (pcVar11 == (char *)0x0) {
                  CVar7 = CURLE_OUT_OF_MEMORY;
                  goto LAB_00577b1a;
                }
                (*Curl_cfree)(local_a0);
                local_a0 = pcVar11;
              }
              if (local_60 != (char *)0x0) {
                pcVar11 = curl_easy_unescape(data,local_60,0,(int *)0x0);
                if (pcVar11 == (char *)0x0) {
                  CVar7 = CURLE_OUT_OF_MEMORY;
                }
                else {
                  (*Curl_cfree)(local_88);
                  local_88 = pcVar11;
                }
              }
            }
          }
LAB_00577b1a:
          (*Curl_cfree)(local_78);
          (*Curl_cfree)(local_58);
          (*Curl_cfree)(local_60);
          if (CVar7 == CURLE_OK) {
            pcVar11 = (pcVar10->host).name;
            if ((*pcVar11 == '[') && (pcVar11 = strchr(pcVar11,0x25), pcVar11 != (char *)0x0)) {
              lVar20 = 3;
              iVar6 = strncmp("%25",pcVar11,3);
              if (iVar6 != 0) {
                Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                lVar20 = 1;
              }
              uVar18 = strtoul(pcVar11 + lVar20,&local_78,10);
              pcVar16 = local_78;
              if (*local_78 == ']') {
                local_90 = uVar18;
                sVar15 = strlen(local_78);
                memmove(pcVar11,pcVar16,sVar15 + 1);
                pcVar10->scope_id = (uint)local_90;
              }
              else {
                Curl_infof(data,"Invalid IPv6 address format\n");
              }
            }
            uVar2 = (data->set).scope_id;
            if (uVar2 != 0) {
              pcVar10->scope_id = uVar2;
            }
            pcVar11 = strchr(local_b8,0x23);
            if (pcVar11 != (char *)0x0) {
              *pcVar11 = '\0';
              pcVar11 = strchr((data->change).url,0x23);
              if (pcVar11 != (char *)0x0) {
                *pcVar11 = '\0';
              }
            }
            pCVar22 = &Curl_handler_http;
            ppCVar21 = protocols;
            do {
              ppCVar21 = ppCVar21 + 1;
              iVar6 = Curl_raw_equal(pCVar22->scheme,local_c0);
              if (iVar6 != 0) {
                if ((((uint)(data->set).allowed_protocols & pCVar22->protocol) != 0) &&
                   (((data->state).this_is_a_follow != true ||
                    (((uint)(data->set).redir_protocols & pCVar22->protocol) != 0)))) {
                  pcVar10->given = pCVar22;
                  pcVar10->handler = pCVar22;
                  CVar7 = CURLE_OK;
                  goto LAB_00577d1f;
                }
                break;
              }
              pCVar22 = *ppCVar21;
            } while (pCVar22 != (Curl_handler *)0x0);
            Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_c0);
            CVar7 = CURLE_UNSUPPORTED_PROTOCOL;
          }
        }
        else {
          if ((data->set).path_as_is != false) goto LAB_005779bc;
          pcVar11 = Curl_dedotdotify(local_b8);
          if (pcVar11 != (char *)0x0) {
            iVar6 = strcmp(pcVar11,local_b8);
            if (iVar6 == 0) {
              (*Curl_cfree)(pcVar11);
            }
            else {
              (*Curl_cfree)((data->state).pathbuffer);
              (data->state).pathbuffer = pcVar11;
              (data->state).path = pcVar11;
              bVar3 = true;
              local_b8 = pcVar11;
            }
          }
          if (pcVar11 != (char *)0x0) goto LAB_005779bc;
LAB_00577bed:
          CVar7 = CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        bVar23 = false;
        Curl_failf(data,"Illegal characters found in URL");
        CVar7 = CURLE_URL_MALFORMAT;
        in_connect = local_b0;
      }
LAB_00577d1f:
      if (CVar7 != CURLE_OK) goto LAB_00577e54;
      if (bVar23) {
        pcVar11 = curl_maprintf("%s://%s",pcVar10->handler->scheme,(data->change).url);
        if (pcVar11 == (char *)0x0) {
          CVar7 = CURLE_OUT_OF_MEMORY;
        }
        else {
          if ((data->change).url_alloc == true) {
            (*Curl_cfree)((data->change).url);
            (data->change).url = (char *)0x0;
            (data->change).url_alloc = false;
          }
          (data->change).url = pcVar11;
          (data->change).url_alloc = true;
          CVar7 = CURLE_OK;
        }
        if (pcVar11 == (char *)0x0) goto LAB_00577e54;
      }
      if (((pcVar10->given->flags & 0x40) != 0) &&
         (pcVar11 = strchr((pcVar10->data->state).path,0x3f), pcVar11 != (char *)0x0)) {
        *pcVar11 = '\0';
      }
      pcVar11 = (data->set).str[0x27];
      if (pcVar11 != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pcVar11);
        pcVar10->xoauth2_bearer = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_00577e4f;
      }
      if (((pcVar10->bits).proxy_user_passwd == true) &&
         (CVar7 = parse_proxy_auth(data,pcVar10), CVar7 != CURLE_OK)) goto LAB_00577e54;
      pcVar11 = (data->set).str[0xf];
      if (pcVar11 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pcVar11 = (*Curl_cstrdup)(pcVar11);
        if (pcVar11 == (char *)0x0) {
          Curl_failf(data,"memory shortage");
          goto LAB_00577e4f;
        }
      }
      pcVar16 = (data->set).str[0x21];
      if ((pcVar16 == (char *)0x0) ||
         (_Var24 = check_noproxy((pcVar10->host).name,pcVar16), !_Var24)) {
        if (pcVar11 == (char *)0x0) {
          pcVar11 = detect_proxy(pcVar10);
        }
      }
      else {
        (*Curl_cfree)(pcVar11);
        pcVar11 = (char *)0x0;
      }
      if (pcVar11 == (char *)0x0) {
LAB_00577f54:
        pcVar11 = (char *)0x0;
      }
      else if ((*pcVar11 == '\0') || ((pcVar10->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar11);
        goto LAB_00577f54;
      }
      if (pcVar11 == (char *)0x0) {
        (pcVar10->bits).proxy = false;
        (pcVar10->bits).httpproxy = false;
        (pcVar10->bits).proxy_user_passwd = false;
        (pcVar10->bits).tunnel_proxy = false;
      }
      else {
        CVar7 = parse_proxy(data,pcVar10,pcVar11);
        (*Curl_cfree)(pcVar11);
        if (CVar7 != CURLE_OK) goto LAB_00577e54;
        if (pcVar10->proxytype < 2) {
          cVar4 = '\x01';
          lVar20 = 0x28b;
          if (((pcVar10->handler->protocol & 3) == 0) && ((pcVar10->bits).tunnel_proxy == false)) {
            pcVar10->handler = &Curl_handler_http;
          }
        }
        else {
          (pcVar10->bits).httpproxy = false;
          lVar20 = 0x295;
          cVar4 = '\0';
        }
        (pcVar10->chunk).hexbuffer[lVar20 + -8] = cVar4;
        (pcVar10->bits).proxy = true;
      }
      if (((pcVar10->given->flags & 1) != 0) && ((pcVar10->bits).httpproxy == true)) {
        (pcVar10->bits).tunnel_proxy = true;
      }
      CVar7 = parse_remote_port(data,pcVar10);
      if ((((CVar7 == CURLE_OK) &&
           (CVar7 = override_login(data,pcVar10,&local_98,&local_a0,&local_88), CVar7 == CURLE_OK))
          && (CVar7 = set_login(pcVar10,local_98,local_a0,local_88), CVar7 == CURLE_OK)) &&
         (CVar7 = setup_connection_internals(pcVar10), CVar7 == CURLE_OK)) {
        pcVar10->recv[0] = Curl_recv_plain;
        pcVar10->send[0] = Curl_send_plain;
        pcVar10->recv[1] = Curl_recv_plain;
        pcVar10->send[1] = Curl_send_plain;
        if ((pcVar10->handler->flags & 0x10) == 0) {
          pcVar11 = (data->set).str[0x14];
          (data->set).ssl.CApath = (data->set).str[0x13];
          (data->set).ssl.CAfile = pcVar11;
          pcVar11 = (data->set).str[0x1b];
          (data->set).ssl.CRLfile = (data->set).str[0x1a];
          (data->set).ssl.issuercert = pcVar11;
          (data->set).ssl.random_file = (data->set).str[0x18];
          (data->set).ssl.egdsocket = (data->set).str[0x17];
          (data->set).ssl.cipher_list = (data->set).str[0x16];
          pcVar11 = (char *)&pcVar10->ssl_config;
          _Var24 = Curl_clone_ssl_config(&(data->set).ssl,(ssl_config_data *)pcVar11);
          CVar7 = CURLE_OUT_OF_MEMORY;
          if (_Var24) {
            prune_dead_connections(data);
            if (((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)) {
              _Var24 = false;
            }
            else {
              pcVar11 = (char *)pcVar10;
              _Var24 = ConnectionExists(data,pcVar10,&local_68,&local_c1,&local_c2);
            }
            pcVar19 = local_68;
            if (((_Var24 != false) && (local_c1 == false)) &&
               ((pcVar11 = (char *)local_68, _Var5 = IsPipeliningPossible(data,local_68), _Var5 &&
                (pcVar19->recv_pipe->size + pcVar19->send_pipe->size != 0)))) {
              pcVar11 = "Found connection %ld, with requests in the pipe (%zu)\n";
              Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
                         pcVar19->connection_id);
              if (((SessionHandle *)pcVar19->bundle->num_connections < local_80) &&
                 (((data->state).conn_cache)->num_connections < local_70)) {
                pcVar11 = "We can reuse, but we want a new connection anyway\n";
                _Var24 = false;
                Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
              }
            }
            pcVar19 = local_68;
            if (_Var24 == false) {
              bVar23 = local_c2 == false;
              if (bVar23) {
                pcVar11 = (char *)(data->state).conn_cache;
                pSVar8 = (SessionHandle *)Curl_conncache_find_bundle(pcVar10,(conncache *)pcVar11);
              }
              else {
                pSVar8 = (SessionHandle *)0x0;
              }
              if (((local_80 != (SessionHandle *)0x0) && (pSVar8 != (SessionHandle *)0x0)) &&
                 (local_80 <= pSVar8->prev)) {
                pcVar19 = find_oldest_idle_connection_in_bundle(pSVar8,(connectbundle *)pcVar11);
                if (pcVar19 == (connectdata *)0x0) {
                  bVar23 = false;
                  Curl_infof(data,"No more connections allowed to host: %d\n",local_80);
                }
                else {
                  pcVar19->data = data;
                  Curl_disconnect(pcVar19,false);
                }
              }
              if (((bool)(local_70 != 0 & bVar23)) &&
                 (local_70 <= ((data->state).conn_cache)->num_connections)) {
                pcVar19 = find_oldest_idle_connection(data);
                if (pcVar19 == (connectdata *)0x0) {
                  bVar23 = false;
                  Curl_infof(data,"No connections available in cache\n");
                }
                else {
                  pcVar19->data = data;
                  Curl_disconnect(pcVar19,false);
                }
              }
              if (!bVar23) {
                Curl_infof(data,"No connections available.\n");
                conn_free(pcVar10);
                *local_b0 = (connectdata *)0x0;
                CVar7 = CURLE_NO_CONNECTION_AVAILABLE;
                in_connect = local_b0;
                asyncp = local_a8;
                goto LAB_00577e54;
              }
              Curl_conncache_add_conn((data->state).conn_cache,pcVar10);
            }
            else {
              local_68->inuse = true;
              reuse_conn(pcVar10,local_68);
              (*Curl_cfree)(pcVar10);
              *local_b0 = pcVar19;
              fix_hostname(data,(connectdata *)&pcVar19->host,host);
              pcVar11 = "host";
              if ((pcVar19->bits).proxy != false) {
                pcVar11 = "proxy";
              }
              Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",
                         pcVar19->connection_id,pcVar11,
                         *(undefined8 *)
                          (pcVar19->primary_ip +
                          (ulong)((pcVar19->proxy).name != (char *)0x0) * 0x20 + -0x34));
              pcVar10 = pcVar19;
            }
            pcVar10->inuse = true;
            Curl_init_do(data,pcVar10);
            CVar7 = setup_range(data);
            asyncp = local_a8;
            in_connect = local_b0;
            if (CVar7 == CURLE_OK) {
              pcVar10->seek_func = (data->set).seek_func;
              pcVar10->seek_client = (data->set).seek_client;
              CVar7 = resolve_server(data,pcVar10,local_a8);
              in_connect = local_b0;
            }
          }
        }
        else {
          CVar7 = (*pcVar10->handler->connect_it)(pcVar10,(_Bool *)local_48);
          if (CVar7 == CURLE_OK) {
            pcVar10->data = data;
            (pcVar10->bits).tcpconnect[0] = true;
            Curl_conncache_add_conn((data->state).conn_cache,pcVar10);
            CVar7 = setup_range(data);
            if (CVar7 != CURLE_OK) {
              (*pcVar10->handler->done)(pcVar10,CVar7,false);
              in_connect = local_b0;
              asyncp = local_a8;
              goto LAB_00577e54;
            }
            CVar7 = CURLE_OK;
            Curl_setup_transfer(pcVar10,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
          }
          Curl_init_do(data,pcVar10);
          in_connect = local_b0;
          asyncp = local_a8;
        }
      }
      goto LAB_00577e54;
    }
    (*Curl_cfree)((data->state).pathbuffer);
    (data->state).pathbuffer = (char *)0x0;
    (data->state).path = (char *)0x0;
  }
  CVar7 = CURLE_OUT_OF_MEMORY;
  in_connect = in_connect;
  asyncp = local_a8;
LAB_00577e54:
  (*Curl_cfree)(local_88);
  (*Curl_cfree)(local_a0);
  (*Curl_cfree)(local_98);
  (*Curl_cfree)((void *)0x0);
  if (CVar7 == CURLE_OK) {
    pcVar10 = *in_connect;
    if ((pcVar10->send_pipe->size == 0) && (pcVar10->recv_pipe->size == 0)) {
      CVar7 = CURLE_OK;
      if (*asyncp == false) {
        CVar7 = Curl_setup_conn(pcVar10,local_50);
      }
    }
    else {
      *local_50 = true;
      CVar7 = CURLE_OK;
    }
  }
  if (CVar7 != CURLE_OK) {
    if (CVar7 != CURLE_NO_CONNECTION_AVAILABLE) {
      if (*in_connect == (connectdata *)0x0) {
        return CVar7;
      }
      Curl_disconnect(*in_connect,false);
    }
    *in_connect = (connectdata *)0x0;
  }
  return CVar7;
}

Assistant:

CURLcode Curl_connect(struct SessionHandle *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }

  if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return result;
}